

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack27_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  uVar2 = in[1];
  *out = uVar1 & 0x7ffffff;
  out[1] = uVar1 >> 0x1b;
  out[1] = uVar1 >> 0x1b | (uVar2 & 0x3fffff) << 5;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x16;
  out[2] = uVar2 >> 0x16 | (uVar1 & 0x1ffff) << 10;
  out[3] = uVar1 >> 0x11;
  uVar2 = in[3];
  uVar3 = in[4];
  out[3] = uVar1 >> 0x11 | (uVar2 & 0xfff) << 0xf;
  out[4] = uVar2 >> 0xc;
  out[4] = uVar2 >> 0xc | (uVar3 & 0x7f) << 0x14;
  uVar1 = in[5];
  out[5] = uVar3 >> 7;
  out[5] = uVar3 >> 7 | (uVar1 & 3) << 0x19;
  out[6] = uVar1 >> 2 & 0x7ffffff;
  uVar2 = in[6];
  out[7] = uVar1 >> 0x1d;
  out[7] = (uVar2 & 0xffffff) << 3 | uVar1 >> 0x1d;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack27_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;

  return in + 1;
}